

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  int value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  CppType CVar3;
  string *psVar4;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  FieldOptions *pFVar7;
  FieldOptions *pFVar8;
  string local_40;
  Type local_20;
  Label local_1c;
  FieldDescriptorProto *local_18;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *this_local;
  
  local_18 = proto;
  proto_local = (FieldDescriptorProto *)this;
  psVar4 = name_abi_cxx11_(this);
  FieldDescriptorProto::set_name(proto,psVar4);
  pFVar1 = local_18;
  value = number(this);
  FieldDescriptorProto::set_number(pFVar1,value);
  pFVar1 = local_18;
  local_1c = label(this);
  value_00 = internal::implicit_cast<int,google::protobuf::FieldDescriptor::Label>(&local_1c);
  FieldDescriptorProto::set_label(pFVar1,value_00);
  pFVar1 = local_18;
  local_20 = type(this);
  value_01 = internal::implicit_cast<int,google::protobuf::FieldDescriptor::Type>(&local_20);
  FieldDescriptorProto::set_type(pFVar1,value_01);
  bVar2 = is_extension(this);
  if (bVar2) {
    pDVar5 = containing_type(this);
    if (((byte)pDVar5[0x29] & 1) == 0) {
      FieldDescriptorProto::set_extendee(local_18,".");
    }
    psVar4 = FieldDescriptorProto::mutable_extendee_abi_cxx11_(local_18);
    pDVar5 = containing_type(this);
    Descriptor::full_name_abi_cxx11_(pDVar5);
    std::__cxx11::string::append((string *)psVar4);
  }
  CVar3 = cpp_type(this);
  if (CVar3 == CPPTYPE_MESSAGE) {
    pDVar5 = message_type(this);
    if (((byte)pDVar5[0x28] & 1) != 0) {
      FieldDescriptorProto::clear_type(local_18);
    }
    pDVar5 = message_type(this);
    if (((byte)pDVar5[0x29] & 1) == 0) {
      FieldDescriptorProto::set_type_name(local_18,".");
    }
    psVar4 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_18);
    pDVar5 = message_type(this);
    Descriptor::full_name_abi_cxx11_(pDVar5);
    std::__cxx11::string::append((string *)psVar4);
  }
  else {
    CVar3 = cpp_type(this);
    if (CVar3 == CPPTYPE_ENUM) {
      pEVar6 = enum_type(this);
      if (((byte)pEVar6[0x29] & 1) == 0) {
        FieldDescriptorProto::set_type_name(local_18,".");
      }
      psVar4 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_18);
      pEVar6 = enum_type(this);
      EnumDescriptor::full_name_abi_cxx11_(pEVar6);
      std::__cxx11::string::append((string *)psVar4);
    }
  }
  bVar2 = has_default_value(this);
  pFVar1 = local_18;
  if (bVar2) {
    DefaultValueAsString_abi_cxx11_(&local_40,this,false);
    FieldDescriptorProto::set_default_value(pFVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pFVar7 = options(this);
  pFVar8 = FieldOptions::default_instance();
  if (pFVar7 != pFVar8) {
    pFVar7 = FieldDescriptorProto::mutable_options(local_18);
    pFVar8 = options(this);
    FieldOptions::CopyFrom(pFVar7,pFVar8);
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}